

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall chaiscript::parser::ChaiScript_Parser::Class_Statements(ChaiScript_Parser *this)

{
  bool bVar1;
  Position start;
  bool saw_eol;
  bool has_more;
  bool retval;
  bool in_stack_0000018f;
  ChaiScript_Parser *in_stack_00000190;
  undefined1 in_stack_000001ff;
  ChaiScript_Parser *in_stack_00000200;
  ChaiScript_Parser *in_stack_ffffffffffffff80;
  undefined1 local_a;
  undefined1 local_9;
  
  local_9 = false;
  local_a = true;
  while (local_a != false) {
    bVar1 = Def(in_stack_00000190,in_stack_0000018f);
    if ((bVar1) || (bVar1 = Var_Decl(in_stack_00000200,(bool)in_stack_000001ff), bVar1)) {
      local_a = true;
      local_9 = true;
    }
    else {
      local_a = Eol(in_stack_ffffffffffffff80);
      if (local_a) {
        local_9 = true;
      }
    }
  }
  return local_9;
}

Assistant:

bool Class_Statements() {
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def(true) || Var_Decl(true)) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          } else if (Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          } else {
            has_more = false;
          }
        }

        return retval;
      }